

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDocumentation.cxx
# Opt level: O0

void __thiscall
cmDocumentation::GlobHelp
          (cmDocumentation *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *files,string *pattern)

{
  bool bVar1;
  string *__lhs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__x;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  undefined1 local_98 [8];
  string findExpr;
  Glob gl;
  string *pattern_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *files_local;
  cmDocumentation *this_local;
  
  cmsys::Glob::Glob((Glob *)((long)&findExpr.field_2 + 8));
  __lhs = cmSystemTools::GetCMakeRoot_abi_cxx11_();
  std::operator+(&local_d8,__lhs,"/Help/");
  std::operator+(&local_b8,&local_d8,pattern);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98,
                 &local_b8,".rst");
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_d8);
  bVar1 = cmsys::Glob::FindFiles
                    ((Glob *)((long)&findExpr.field_2 + 8),(string *)local_98,(GlobMessages *)0x0);
  if (bVar1) {
    __x = cmsys::Glob::GetFiles_abi_cxx11_((Glob *)((long)&findExpr.field_2 + 8));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=(files,__x);
  }
  std::__cxx11::string::~string((string *)local_98);
  cmsys::Glob::~Glob((Glob *)((long)&findExpr.field_2 + 8));
  return;
}

Assistant:

void cmDocumentation::GlobHelp(std::vector<std::string>& files,
                               std::string const& pattern)
{
  cmsys::Glob gl;
  std::string findExpr =
    cmSystemTools::GetCMakeRoot() + "/Help/" + pattern + ".rst";
  if (gl.FindFiles(findExpr)) {
    files = gl.GetFiles();
  }
}